

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

istream * __thiscall nivalis::Plotter::import_binary_func_and_env(Plotter *this,istream *is)

{
  pointer pFVar1;
  ulong uVar2;
  long lVar3;
  size_t sz;
  size_type local_30;
  
  std::istream::read((char *)is,(long)&this->curr_func);
  std::istream::read((char *)is,(long)&local_30);
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::resize(&this->funcs,local_30);
  pFVar1 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Function::from_bin((Function *)((long)(pFVar1->line_color).data + lVar3 + -0x20),is);
      uVar2 = uVar2 + 1;
      pFVar1 = (this->funcs).
               super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x130;
    } while (uVar2 < (ulong)(((long)(this->funcs).
                                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)
                            * -0x79435e50d79435e5));
  }
  std::istream::read((char *)is,(long)&this->view);
  std::istream::read((char *)is,(long)&this->x_var);
  std::istream::read((char *)is,(long)&this->y_var);
  std::istream::read((char *)is,(long)&this->t_var);
  std::istream::read((char *)is,(long)&this->r_var);
  Environment::from_bin(&this->env,is);
  return is;
}

Assistant:

std::istream& Plotter::import_binary_func_and_env(std::istream& is) {
    util::read_bin(is, curr_func);
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].from_bin(is);
    }
    util::read_bin(is, view);
    util::read_bin(is, x_var);
    util::read_bin(is, y_var);
    util::read_bin(is, t_var);
    util::read_bin(is, r_var);
    env.from_bin(is);
    return is;
}